

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O1

void __thiscall
deqp::gls::ShaderExecUtil::TessControlExecutor::execute
          (TessControlExecutor *this,int numValues,void **inputs,void **outputs)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_BufferIoExecutor).super_ShaderExecutor.m_renderCtx)->_vptr_RenderContext
            [3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  BufferIoExecutor::initBuffers(&this->super_BufferIoExecutor,numValues);
  BufferIoExecutor::uploadInputBuffer(&this->super_BufferIoExecutor,inputs,numValues);
  if ((this->super_BufferIoExecutor).super_ShaderExecutor.m_inputs.
      super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->super_BufferIoExecutor).super_ShaderExecutor.m_inputs.
      super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (**(code **)(lVar2 + 0x48))
              (0x90d2,0,(this->super_BufferIoExecutor).m_inputBuffer.super_ObjectWrapper.m_object);
  }
  (**(code **)(lVar2 + 0x48))
            (0x90d2,1,(this->super_BufferIoExecutor).m_outputBuffer.super_ObjectWrapper.m_object);
  (**(code **)(lVar2 + 0xfd8))(0x8e72,3);
  (**(code **)(lVar2 + 0x538))(0xe,0,numValues * 3);
  BufferIoExecutor::readOutputBuffer(&this->super_BufferIoExecutor,outputs,numValues);
  return;
}

Assistant:

void TessControlExecutor::execute (int numValues, const void* const* inputs, void* const* outputs)
{
	const glw::Functions&	gl	= m_renderCtx.getFunctions();

	initBuffers(numValues);

	// Setup input buffer & copy data
	uploadInputBuffer(inputs, numValues);

	if (!m_inputs.empty())
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, INPUT_BUFFER_BINDING, getInputBuffer());

	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, OUTPUT_BUFFER_BINDING, getOutputBuffer());

	// Render patches
	gl.patchParameteri(GL_PATCH_VERTICES, 3);
	gl.drawArrays(GL_PATCHES, 0, 3*numValues);

	// Read back data
	readOutputBuffer(outputs, numValues);
}